

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_flash_attn_ext(ggml_context *ctx,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,ggml_tensor *mask
                   ,float scale,float max_bias,float logit_softcap)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  char *pcVar2;
  int line;
  float params [3];
  int64_t ne [4];
  
  _Var1 = ggml_can_mul_mat(k,q);
  if (_Var1) {
    if (mask == (ggml_tensor *)0x0) {
      if (max_bias <= 0.0) {
        ne[2] = q->ne[1];
LAB_00123eb9:
        ne[0] = v->ne[0];
        ne[1] = q->ne[2];
        ne[3] = q->ne[3];
        tensor = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
        params[0] = scale;
        params[1] = max_bias;
        params[2] = logit_softcap;
        ggml_set_op_params(tensor,params,0xc);
        tensor->op = GGML_OP_FLASH_ATTN_EXT;
        tensor->src[0] = q;
        tensor->src[1] = k;
        tensor->src[2] = v;
        tensor->src[3] = mask;
        return tensor;
      }
      pcVar2 = "mask";
      line = 0x1142;
    }
    else {
      _Var1 = ggml_is_contiguous_0(mask);
      if (_Var1) {
        if (mask->ne[2] == 1) {
          if (mask->ne[3] == 1) {
            ne[2] = q->ne[1];
            if ((long)(ne[2] + 0x3fU & 0xffffffffffffffc0) <= mask->ne[1]) goto LAB_00123eb9;
            pcVar2 = 
            "mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) && \"the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big\""
            ;
            line = 0x113d;
          }
          else {
            pcVar2 = "mask->ne[3] == 1";
            line = 0x113b;
          }
        }
        else {
          pcVar2 = "mask->ne[2] == 1";
          line = 0x113a;
        }
      }
      else {
        pcVar2 = "ggml_is_contiguous(mask)";
        line = 0x1139;
      }
    }
  }
  else {
    pcVar2 = "ggml_can_mul_mat(k, q)";
    line = 0x1135;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_flash_attn_ext(
        struct ggml_context * ctx,
        struct ggml_tensor  * q,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        float                 logit_softcap) {
    GGML_ASSERT(ggml_can_mul_mat(k, q));
    // TODO: check if vT can be multiplied by (k*qT)

    if (mask) {
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(mask->ne[2] == 1);
        GGML_ASSERT(mask->ne[3] == 1);
        GGML_ASSERT(mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) &&
                "the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big");
        //GGML_ASSERT(ggml_can_repeat_rows(mask, qk));
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    // permute(0, 2, 1, 3)
    int64_t ne[4] = { v->ne[0], q->ne[2], q->ne[1], q->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    float params[] = { scale, max_bias, logit_softcap };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_FLASH_ATTN_EXT;
    result->src[0] = q;
    result->src[1] = k;
    result->src[2] = v;
    result->src[3] = mask;

    return result;
}